

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync.h
# Opt level: O0

void __thiscall
UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
          (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *this,
          AnnotatedMixin<std::recursive_mutex> *pmutexIn,char *pszName,char *pszFile,int nLine,
          bool fTry)

{
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RCX;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDX;
  long in_RSI;
  unique_lock<std::recursive_mutex> *in_RDI;
  undefined4 in_R8D;
  undefined1 in_R9B;
  long in_FS_OFFSET;
  unique_lock<std::recursive_mutex> *in_stack_ffffffffffffff98;
  unique_lock<std::recursive_mutex> *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined3 in_stack_ffffffffffffffc0;
  uint uVar1;
  unique_lock<std::recursive_mutex> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = CONCAT13(in_R9B,in_stack_ffffffffffffffc0) & 0x1ffffff;
  std::unique_lock<std::recursive_mutex>::unique_lock(in_stack_ffffffffffffff98);
  if (in_RSI != 0) {
    std::unique_lock<std::recursive_mutex>::unique_lock(&local_18,in_RSI);
    std::unique_lock<std::recursive_mutex>::operator=(in_RDI,in_stack_ffffffffffffffa0);
    std::unique_lock<std::recursive_mutex>::~unique_lock(in_stack_ffffffffffffff98);
    if ((uVar1 & 0x1000000) == 0) {
      Enter(in_RCX,(char *)CONCAT44(in_R8D,uVar1),
            (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
            in_stack_ffffffffffffffb4);
    }
    else {
      TryEnter(in_RDX,(char *)in_RCX,(char *)CONCAT44(in_R8D,uVar1),in_stack_ffffffffffffffbc);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

EXCLUSIVE_LOCK_FUNCTION(pmutexIn)
    {
        if (!pmutexIn) return;

        *static_cast<Base*>(this) = Base(*pmutexIn, std::defer_lock);
        if (fTry)
            TryEnter(pszName, pszFile, nLine);
        else
            Enter(pszName, pszFile, nLine);
    }